

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCall_callWithObjectParameter_TestShell::createTest
          (TEST_MockExpectedCall_callWithObjectParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithObjectParameter_Test *this_00;
  TEST_MockExpectedCall_callWithObjectParameter_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCall_callWithObjectParameter_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x14e);
  TEST_MockExpectedCall_callWithObjectParameter_Test::
  TEST_MockExpectedCall_callWithObjectParameter_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameter)
{
    const SimpleString paramName = "paramName";
    void* value = (void*) 0x123;
    call->withParameterOfType("ClassName", paramName, value);
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getConstObjectPointer());
    STRCMP_EQUAL("ClassName", call->getInputParameterType(paramName).asCharString());
    STRCMP_CONTAINS("funcName -> ClassName paramName: <No comparator found for type: \"ClassName\">", call->callToString().asCharString());
}